

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void luaH_setint(lua_State *L,Table *t,int key,TValue *value)

{
  TValue *io1;
  TValue *pTVar1;
  TValue *io2;
  TValue k;
  Value local_30;
  undefined4 local_28;
  
  pTVar1 = luaH_getint(t,key);
  if (pTVar1 == &luaO_nilobject_) {
    local_30.n = (lua_Number)key;
    local_28 = 3;
    pTVar1 = luaH_newkey(L,t,(TValue *)&local_30);
  }
  pTVar1->value_ = value->value_;
  pTVar1->tt_ = value->tt_;
  return;
}

Assistant:

void luaH_setint (lua_State *L, Table *t, int key, TValue *value) {
  const TValue *p = luaH_getint(t, key);
  TValue *cell;
  if (p != luaO_nilobject)
    cell = cast(TValue *, p);
  else {
    TValue k;
    setnvalue(&k, cast_num(key));
    cell = luaH_newkey(L, t, &k);
  }
  setobj2t(L, cell, value);
}